

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

int Aig_ManSeqCleanupBasic(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  for (iVar5 = 0; iVar5 < p->nObjs[2] - p->nRegs; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar5);
    *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
  }
  p_00 = Vec_PtrAlloc(100);
  for (iVar5 = 0; iVar1 = p->nRegs, iVar5 < p->nObjs[3] - iVar1; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,iVar5);
    Vec_PtrPush(p_00,pvVar2);
  }
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar3 = Aig_ManLi(p,iVar5);
    pAVar4 = Aig_ManLo(p,iVar5);
    (pAVar4->field_0).pNext = pAVar3;
    iVar1 = p->nRegs;
  }
  for (iVar5 = 0; iVar1 = p_00->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar5);
    Aig_ManSeqCleanup_rec(p,pAVar3,p_00);
  }
  if (iVar1 <= p->nObjs[3]) {
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      Aig_ManLi(p,iVar5);
      pAVar3 = Aig_ManLo(p,iVar5);
      (pAVar3->field_0).pNext = (Aig_Obj_t *)0x0;
    }
    if (iVar1 < p->nObjs[3]) {
      for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
        if (pAVar3->TravId != p->nTravIds) {
          Aig_ObjPatchFanin0(p,pAVar3,(Aig_Obj_t *)((ulong)p->pConst1 ^ 1));
        }
      }
    }
    Vec_PtrFree(p_00);
    iVar5 = Aig_ManCleanup(p);
    return iVar5;
  }
  __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                ,0x119,"int Aig_ManSeqCleanupBasic(Aig_Man_t *)");
}

Assistant:

int Aig_ManSeqCleanupBasic( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        // add constant drivers to the dangling latches
        Aig_ManForEachCo( p, pObj, i )
            if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
                Aig_ObjPatchFanin0( p, pObj, Aig_ManConst0(p) );
    }
    Vec_PtrFree( vNodes );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}